

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_sort_tree.hpp
# Opt level: O0

RESULT_TYPE __thiscall
duckdb::Interpolator<true>::
InterpolateInternal<duckdb::hugeint_t,duckdb::QuantileDirect<duckdb::hugeint_t>>
          (Interpolator<true> *this,hugeint_t *v_t,QuantileDirect<duckdb::hugeint_t> *accessor)

{
  INPUT_TYPE *pIVar1;
  QuantileDirect<duckdb::hugeint_t> *in_RDX;
  long in_RSI;
  hugeint_t *in_RDI;
  RESULT_TYPE RVar2;
  QuantileCompare<duckdb::QuantileDirect<duckdb::hugeint_t>_> in_stack_00000000;
  QuantileCompare<duckdb::QuantileDirect<duckdb::hugeint_t>_> comp;
  QuantileCompare<duckdb::QuantileDirect<duckdb::hugeint_t>_> local_48;
  QuantileDirect<duckdb::hugeint_t> *local_30;
  long local_28;
  hugeint_t *__last;
  hugeint_t *in_stack_ffffffffffffffe8;
  hugeint_t *in_stack_fffffffffffffff0;
  
  local_30 = in_RDX;
  local_28 = in_RSI;
  __last = in_RDI;
  QuantileCompare<duckdb::QuantileDirect<duckdb::hugeint_t>_>::QuantileCompare
            (&local_48,in_RDX,(bool)((byte)in_RDI->lower & 1));
  ::std::
  nth_element<duckdb::hugeint_t*,duckdb::QuantileCompare<duckdb::QuantileDirect<duckdb::hugeint_t>>>
            (in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8,__last,in_stack_00000000);
  pIVar1 = QuantileDirect<duckdb::hugeint_t>::operator()
                     (local_30,(INPUT_TYPE *)(local_28 + in_RDI->upper * 0x10));
  RVar2.lower = pIVar1->lower;
  RVar2.upper = pIVar1->upper;
  return RVar2;
}

Assistant:

typename ACCESSOR::RESULT_TYPE InterpolateInternal(INPUT_TYPE *v_t, const ACCESSOR &accessor = ACCESSOR()) const {
		QuantileCompare<ACCESSOR> comp(accessor, desc);
		std::nth_element(v_t + begin, v_t + FRN, v_t + end, comp);
		return accessor(v_t[FRN]);
	}